

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O0

int address_from_private_key
              (uchar *bytes,size_t bytes_len,uchar network,_Bool compressed,char **output)

{
  int iVar1;
  int local_f4;
  undefined1 local_f0 [3];
  uchar local_ed;
  int ret;
  anon_struct_24_2_b3b0cfa8 buf;
  size_t pub_key_len;
  uchar *pub_key;
  uchar pub_key_long [65];
  uchar local_78 [8];
  uchar pub_key_short [33];
  undefined1 local_48 [8];
  sha256 sha;
  char **output_local;
  _Bool compressed_local;
  uchar network_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  pub_key_len = (size_t)local_78;
  iVar1 = 0x41;
  if (compressed) {
    iVar1 = 0x21;
  }
  buf.hash160.u._12_8_ = SEXT48(iVar1);
  sha.u._24_8_ = output;
  local_f4 = wally_ec_public_key_from_private_key(bytes,bytes_len,local_78,0x21);
  if ((local_f4 == 0) && (!compressed)) {
    local_f4 = wally_ec_public_key_decompress(local_78,0x21,(uchar *)&pub_key,0x41);
    pub_key_len = (size_t)&pub_key;
  }
  if (local_f4 == 0) {
    sha256((sha256 *)local_48,(void *)pub_key_len,buf.hash160.u._12_8_);
    ripemd160((ripemd160 *)&ret,local_48,0x20);
    local_ed = network;
    local_f4 = wally_base58_from_bytes(&local_ed,0x15,1,(char **)sha.u._24_8_);
  }
  wally_clear_4(local_48,0x20,local_78,0x21,&pub_key,0x41,local_f0,0x18);
  return local_f4;
}

Assistant:

static int address_from_private_key(const unsigned char *bytes,
                                    size_t bytes_len,
                                    unsigned char network,
                                    bool compressed,
                                    char **output)
{
    struct sha256 sha;
    unsigned char pub_key_short[EC_PUBLIC_KEY_LEN];
    unsigned char pub_key_long[EC_PUBLIC_KEY_UNCOMPRESSED_LEN];
    unsigned char *pub_key = pub_key_short;
    size_t pub_key_len = compressed ? EC_PUBLIC_KEY_LEN : EC_PUBLIC_KEY_UNCOMPRESSED_LEN;
    struct {
        union {
            uint32_t network;
            unsigned char bytes[4];
        } network_bytes; /* Used for alignment */
        struct ripemd160 hash160;
    } buf;
    int ret;

    /* Network and hash160 must be contiguous */
    BUILD_ASSERT(sizeof(buf) == sizeof(struct ripemd160) + sizeof(uint32_t));

    ret = wally_ec_public_key_from_private_key(bytes, bytes_len,
                                               pub_key_short, sizeof(pub_key_short));
    if (ret == WALLY_OK && !compressed) {
        ret = wally_ec_public_key_decompress(pub_key_short, sizeof(pub_key_short),
                                             pub_key_long, sizeof(pub_key_long));
        pub_key = pub_key_long;
    }
    if (ret == WALLY_OK) {
        sha256(&sha, pub_key, pub_key_len);
        ripemd160(&buf.hash160, &sha, sizeof(sha));
        buf.network_bytes.bytes[3] = network;
        ret = wally_base58_from_bytes(&buf.network_bytes.bytes[3],
                                      sizeof(unsigned char) + sizeof(buf.hash160),
                                      BASE58_FLAG_CHECKSUM, output);
    }
    wally_clear_4(&sha, sizeof(sha), pub_key_short, sizeof(pub_key_short),
                  pub_key_long, sizeof(pub_key_long), &buf, sizeof(buf));
    return ret;
}